

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestCase *pTVar1;
  TestInfo *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer ppTVar4;
  pointer ppTVar5;
  bool bVar6;
  pointer ppTVar7;
  ulong uVar8;
  int iVar9;
  pointer ppTVar10;
  pointer pcVar11;
  ulong uVar12;
  
  ppTVar7 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar10 = (this->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar10 != ppTVar7) {
    uVar8 = 0;
    do {
      pTVar1 = ppTVar7[uVar8];
      ppTVar4 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar5 != ppTVar4) {
        uVar12 = 0;
        bVar6 = false;
        do {
          pTVar2 = ppTVar4[uVar12];
          if (pTVar2->matches_filter_ == true) {
            if (!bVar6) {
              printf("%s.",(pTVar1->name_)._M_dataplus._M_p);
              pbVar3 = (pTVar1->type_param_).ptr_;
              if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
                iVar9 = 0x185e22;
                printf("  # %s = ");
                pbVar3 = (pTVar1->type_param_).ptr_;
                if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                  pcVar11 = (char *)0x0;
                }
                else {
                  pcVar11 = (pbVar3->_M_dataplus)._M_p;
                }
                PrintOnOneLine(pcVar11,iVar9);
              }
              putchar(10);
            }
            printf("  %s",(pTVar2->name_)._M_dataplus._M_p);
            pbVar3 = (pTVar2->value_param_).ptr_;
            if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
               && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
              iVar9 = 0x185e2c;
              printf("  # %s = ");
              pbVar3 = (pTVar2->value_param_).ptr_;
              if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 ) {
                pcVar11 = (char *)0x0;
              }
              else {
                pcVar11 = (pbVar3->_M_dataplus)._M_p;
              }
              PrintOnOneLine(pcVar11,iVar9);
            }
            putchar(10);
            ppTVar4 = (pTVar1->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppTVar5 = (pTVar1->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar6 = true;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)ppTVar5 - (long)ppTVar4 >> 3));
        ppTVar7 = (this->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar10 = (this->test_cases_).
                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)ppTVar10 - (long)ppTVar7 >> 3));
  }
  fflush(_stdout);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (size_t i = 0; i < test_cases_.size(); i++) {
    const TestCase* const test_case = test_cases_[i];
    bool printed_test_case_name = false;

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      const TestInfo* const test_info =
          test_case->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_case_name) {
          printed_test_case_name = true;
          printf("%s.", test_case->name());
          if (test_case->type_param() != NULL) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_case->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != NULL) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
}